

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_encrypt_then_mac_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  undefined8 in_R9;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (len == 0) {
    if (((*(uint *)&ssl->conf->field_0x164 >> 10 & 1) == 1) && (ssl->minor_ver != 0)) {
      ssl->session_negotiate->encrypt_then_mac = 1;
    }
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x16d,"bad client hello message",in_R9,len,buf);
    ssl_local._4_4_ = -0x7900;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_encrypt_then_mac_ext( mbedtls_ssl_context *ssl,
                                      const unsigned char *buf,
                                      size_t len )
{
    if( len != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    ((void) buf);

    if( ssl->conf->encrypt_then_mac == MBEDTLS_SSL_ETM_ENABLED &&
        ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        ssl->session_negotiate->encrypt_then_mac = MBEDTLS_SSL_ETM_ENABLED;
    }

    return( 0 );
}